

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

bool idx2::operator==(stref *Lhs,stref *Rhs)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  stref *RhsR;
  stref *LhsR;
  ulong uVar5;
  
  uVar3 = Lhs->Size;
  if (uVar3 == Rhs->Size) {
    uVar5 = 0;
    uVar4 = 0;
    if (0 < (int)uVar3) {
      uVar5 = (ulong)uVar3;
    }
    do {
      if (uVar5 == uVar4) {
        return (long)(int)uVar3 <= (long)uVar4;
      }
      pcVar1 = (Lhs->field_0).Ptr + uVar4;
      pcVar2 = (Rhs->field_0).Ptr + uVar4;
      uVar4 = uVar4 + 1;
    } while (*pcVar1 == *pcVar2);
  }
  return false;
}

Assistant:

bool
operator==(const stref& Lhs, const stref& Rhs)
{
  stref& LhsR = const_cast<stref&>(Lhs);
  stref& RhsR = const_cast<stref&>(Rhs);
  if (LhsR.Size != RhsR.Size)
    return false;
  for (int I = 0; I < LhsR.Size; ++I)
  {
    if (LhsR[I] != RhsR[I])
      return false;
  }
  return true;
}